

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# package.cpp
# Opt level: O2

void __thiscall icu_63::Package::~Package(Package *this)

{
  Item *buffer;
  long lVar1;
  long lVar2;
  
  uprv_free_63(this->inData);
  lVar1 = 0x14;
  for (lVar2 = 0; buffer = this->items, lVar2 < this->itemCount; lVar2 = lVar2 + 1) {
    if (*(char *)((long)&buffer->name + lVar1) != '\0') {
      uprv_free_63(*(void **)((long)buffer + lVar1 + -0xc));
    }
    lVar1 = lVar1 + 0x18;
  }
  uprv_free_63(buffer);
  return;
}

Assistant:

Package::~Package() {
    int32_t idx;

    uprv_free(inData);

    for(idx=0; idx<itemCount; ++idx) {
        if(items[idx].isDataOwned) {
            uprv_free(items[idx].data);
        }
    }

    uprv_free((void*)items);
}